

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O1

REF_STATUS
ref_iso_boom_zone(FILE *file,REF_GRID_conflict ref_grid,REF_DBL *field,REF_INT ldim,REF_DBL *center,
                 REF_DBL aoa,REF_DBL phi,REF_DBL h)

{
  ulong uVar1;
  REF_MPI pRVar2;
  REF_NODE pRVar3;
  REF_GLOB *pRVar4;
  FILE *__stream;
  uint uVar5;
  int iVar6;
  long lVar7;
  void *my_array;
  REF_DBL *pRVar8;
  REF_DBL *pRVar9;
  REF_INT *sorted_index;
  long lVar10;
  undefined8 uVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  REF_INT RVar17;
  REF_INT n;
  ulong local_f8;
  REF_MPI local_f0;
  REF_DBL local_e8;
  REF_DBL *xyzf;
  REF_DBL *ray_field;
  REF_GRID_conflict ray_grid;
  REF_DBL *local_c8;
  FILE *local_c0;
  REF_DBL local_b8;
  REF_INT *source;
  REF_DBL ds [3];
  REF_DBL dt [3];
  REF_DBL segment0 [3];
  REF_DBL segment1 [3];
  
  pRVar2 = ref_grid->mpi;
  local_e8 = h;
  local_b8 = phi;
  uVar5 = ref_iso_segment(ref_grid,center,aoa,phi,h,segment0,segment1);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x336,
           "ref_iso_boom_zone",(ulong)uVar5,"seg");
    return uVar5;
  }
  lVar7 = 0;
  do {
    ds[lVar7] = segment1[lVar7] - segment0[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_f0 = pRVar2;
  local_c0 = (FILE *)file;
  uVar5 = ref_math_normalize(ds);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x338,
           "ref_iso_boom_zone",(ulong)uVar5,"segment unit vector");
    return uVar5;
  }
  uVar5 = ref_iso_cast(&ray_grid,&ray_field,ref_grid,field,ldim,segment0,segment1);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x33c,
           "ref_iso_boom_zone",(ulong)uVar5,"cast");
    return uVar5;
  }
  pRVar3 = ray_grid->node;
  iVar13 = pRVar3->max;
  lVar7 = (long)iVar13;
  if (lVar7 < 1) {
    iVar6 = 0;
  }
  else {
    lVar10 = 0;
    iVar6 = 0;
    do {
      if (-1 < pRVar3->global[lVar10]) {
        iVar6 = iVar6 + (uint)(pRVar3->ref_mpi->id == pRVar3->part[lVar10]);
      }
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  uVar1 = (long)ldim + 3;
  uVar5 = iVar6 * (int)uVar1;
  if (-1 < (int)uVar5) {
    my_array = malloc((ulong)uVar5 << 3);
    if (my_array == (void *)0x0) {
      pcVar14 = "malloc local_xyzf of REF_DBL NULL";
      uVar11 = 0x344;
    }
    else {
      if (iVar13 < 1) {
        RVar17 = 0;
      }
      else {
        pRVar4 = pRVar3->global;
        lVar10 = 0;
        lVar12 = 0;
        RVar17 = 0;
        pRVar8 = ray_field;
        do {
          if ((-1 < pRVar4[lVar12]) && (pRVar3->ref_mpi->id == pRVar3->part[lVar12])) {
            iVar13 = RVar17 * (int)uVar1;
            pRVar9 = pRVar3->real;
            lVar16 = 0;
            do {
              *(undefined8 *)((long)my_array + lVar16 * 8 + (long)iVar13 * 8) =
                   *(undefined8 *)((long)pRVar9 + lVar16 * 8 + lVar10);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            if (0 < ldim) {
              uVar15 = 0;
              do {
                *(REF_DBL *)((long)my_array + (long)(iVar13 + 3 + (int)uVar15) * 8) = pRVar8[uVar15]
                ;
                uVar15 = uVar15 + 1;
              } while ((uint)ldim != uVar15);
            }
            RVar17 = RVar17 + 1;
          }
          lVar12 = lVar12 + 1;
          lVar10 = lVar10 + 0x78;
          pRVar8 = pRVar8 + ldim;
        } while (lVar12 != lVar7);
      }
      local_f8 = uVar1;
      if (ray_field != (REF_DBL *)0x0) {
        free(ray_field);
      }
      ref_grid_free(ray_grid);
      pRVar2 = local_f0;
      uVar5 = ref_mpi_allconcat(local_f0,(REF_INT)local_f8,RVar17,my_array,&n,&source,&xyzf,3);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x354
               ,"ref_iso_boom_zone",(ulong)uVar5,"concat");
        return uVar5;
      }
      free(my_array);
      if (pRVar2->id != 0) {
        return 0;
      }
      if (source != (REF_INT *)0x0) {
        free(source);
      }
      RVar17 = n;
      lVar7 = (long)n;
      if (lVar7 < 0) {
        pcVar14 = "malloc t of REF_DBL negative";
        uVar11 = 0x358;
        goto LAB_001acaff;
      }
      pRVar8 = (REF_DBL *)malloc(lVar7 * 8);
      if (pRVar8 == (REF_DBL *)0x0) {
        pcVar14 = "malloc t of REF_DBL NULL";
        uVar11 = 0x358;
      }
      else {
        if (RVar17 != 0) {
          lVar10 = 0;
          pRVar9 = xyzf;
          do {
            lVar12 = 0;
            do {
              dt[lVar12] = pRVar9[lVar12] - segment0[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            pRVar8[lVar10] = dt[2] * ds[2] + dt[0] * ds[0] + dt[1] * ds[1];
            lVar10 = lVar10 + 1;
            pRVar9 = pRVar9 + (int)local_f8;
          } while (lVar10 != lVar7);
        }
        sorted_index = (REF_INT *)malloc(lVar7 * 4);
        if (sorted_index != (REF_INT *)0x0) {
          uVar5 = ref_sort_heap_dbl(RVar17,pRVar8,sorted_index);
          __stream = local_c0;
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x35f,"ref_iso_boom_zone",(ulong)uVar5,"sort t");
            return uVar5;
          }
          local_f0 = (REF_MPI)sorted_index;
          local_c8 = pRVar8;
          fprintf(local_c0," zone t=\"PHI=%.1f,R=%.1f\"\n",local_b8,local_e8);
          uVar1 = local_f8;
          if (0 < n) {
            local_e8 = 4.94065645841247e-324;
            if (1 < (int)local_f8) {
              local_e8 = (REF_DBL)(local_f8 & 0xffffffff);
            }
            lVar7 = 0;
            do {
              pRVar2 = local_f0;
              if (-3 < ldim) {
                lVar10 = 0;
                do {
                  fprintf(__stream," %.15e",
                          xyzf[(long)*(int *)((long)pRVar2 + lVar7 * 4) * uVar1 + lVar10]);
                  lVar10 = lVar10 + 1;
                } while (SUB84(local_e8,0) != (int)lVar10);
              }
              fputc(10,__stream);
              lVar7 = lVar7 + 1;
            } while (lVar7 < n);
          }
          free(local_f0);
          free(local_c8);
          if (xyzf == (REF_DBL *)0x0) {
            return 0;
          }
          free(xyzf);
          return 0;
        }
        pcVar14 = "malloc order of REF_INT NULL";
        uVar11 = 0x35e;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar11,
           "ref_iso_boom_zone",pcVar14);
    return 2;
  }
  pcVar14 = "malloc local_xyzf of REF_DBL negative";
  uVar11 = 0x344;
LAB_001acaff:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar11,
         "ref_iso_boom_zone",pcVar14);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_iso_boom_zone(FILE *file, REF_GRID ref_grid,
                                     REF_DBL *field, REF_INT ldim,
                                     REF_DBL *center, REF_DBL aoa, REF_DBL phi,
                                     REF_DBL h) {
  REF_DBL segment0[3], segment1[3], ds[3], dt[3];
  REF_GRID ray_grid;
  REF_DBL *ray_field;
  REF_DBL *local_xyzf, *xyzf, *t;
  REF_NODE ref_node;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT node, local_n, n, *source, i, *order;

  RSS(ref_iso_segment(ref_grid, center, aoa, phi, h, segment0, segment1),
      "seg");
  for (i = 0; i < 3; i++) ds[i] = segment1[i] - segment0[i];
  RSS(ref_math_normalize(ds), "segment unit vector");

  RSS(ref_iso_cast(&ray_grid, &ray_field, ref_grid, field, ldim, segment0,
                   segment1),
      "cast");
  ref_node = ref_grid_node(ray_grid);
  local_n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      local_n++;
    }
  }
  ref_malloc(local_xyzf, local_n * (3 + ldim), REF_DBL);
  local_n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      for (i = 0; i < 3; i++)
        local_xyzf[i + (3 + ldim) * local_n] = ref_node_xyz(ref_node, i, node);
      for (i = 0; i < ldim; i++)
        local_xyzf[3 + i + (3 + ldim) * local_n] = ray_field[i + node * ldim];
      local_n++;
    }
  }
  ref_free(ray_field);
  ref_grid_free(ray_grid);

  RSS(ref_mpi_allconcat(ref_mpi, 3 + ldim, local_n, local_xyzf, &n, &source,
                        (void **)(&xyzf), REF_DBL_TYPE),
      "concat");
  ref_free(local_xyzf);
  if (ref_mpi_once(ref_mpi)) {
    ref_free(source);
    ref_malloc(t, n, REF_DBL);

    for (node = 0; node < n; node++) {
      for (i = 0; i < 3; i++) dt[i] = xyzf[i + (3 + ldim) * node] - segment0[i];
      t[node] = ref_math_dot(dt, ds);
    }
    ref_malloc(order, n, REF_INT);
    RSS(ref_sort_heap_dbl(n, t, order), "sort t");
    fprintf(file, " zone t=\"PHI=%.1f,R=%.1f\"\n", phi, h);
    for (node = 0; node < n; node++) {
      for (i = 0; i < 3 + ldim; i++) {
        fprintf(file, " %.15e", xyzf[i + (3 + ldim) * order[node]]);
      }
      fprintf(file, "\n");
    }
    ref_free(order);
    ref_free(t);
    ref_free(xyzf);
  }

  return REF_SUCCESS;
}